

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

cf_char_t * cf_strrchr(cf_char_t *s,cf_char_t c)

{
  bool bVar1;
  cf_size_t local_28;
  cf_size_t n;
  char *pcStack_18;
  cf_char_t c_local;
  cf_char_t *s_local;
  
  if (s == (cf_char_t *)0x0) {
    s_local = (cf_char_t *)0x0;
  }
  else {
    local_28 = cf_strlen(s);
    pcStack_18 = s + local_28;
    while( true ) {
      bVar1 = false;
      if (local_28 != 0) {
        bVar1 = *pcStack_18 != c;
      }
      if (!bVar1) break;
      local_28 = local_28 - 1;
      pcStack_18 = pcStack_18 + -1;
    }
    s_local = pcStack_18;
  }
  return s_local;
}

Assistant:

cf_char_t* cf_strrchr(const cf_char_t* s, cf_char_t c) {
    cf_size_t n;
    if(!s) return CF_NULL_PTR;
    n = cf_strlen(s);
    s += n;
    while(n > 0 && *s != c) n--, s--;
    return (n < 0 ? CF_NULL_PTR : (cf_char_t*)s);
}